

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_small_vector.cpp
# Opt level: O1

void __thiscall SmallVector_MoveCtor_Test::TestBody(SmallVector_MoveCtor_Test *this)

{
  long lVar1;
  long lVar2;
  char *message;
  AssertionResult gtest_ar;
  AssertHelper local_a0;
  char local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  void *local_60;
  undefined8 uStack_58;
  long local_50;
  undefined8 *puStack_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  void *local_28;
  undefined8 local_20;
  long lStack_18;
  undefined8 *local_10;
  
  puStack_48 = &local_70;
  local_78 = 4;
  local_50 = 0;
  local_70 = 0;
  uStack_68 = 0;
  uStack_58 = 0;
  lVar1 = 0x10;
  lVar2 = 0;
  do {
    *(int *)((long)&local_70 + lVar2 * 4) = (int)lVar2;
    lVar2 = lVar2 + 1;
    lVar1 = lVar1 + -4;
  } while (lVar1 != 0);
  local_10 = &local_38;
  local_40 = 4;
  local_38 = local_70;
  uStack_30 = uStack_68;
  local_28 = (void *)0x0;
  local_20 = uStack_58;
  lStack_18 = local_50;
  local_50 = 0;
  local_60 = (void *)0x0;
  uStack_58 = 0;
  local_88._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_200000003;
  uStack_80 = 1;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int,int>>>
  ::operator()(local_98,(char *)&local_88,(small_vector<int,_4UL> *)0x209135);
  if (local_98[0] == '\0') {
    testing::Message::Message((Message *)&local_88);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x53,message);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  if (local_28 != (void *)0x0) {
    operator_delete(local_28,lStack_18 - (long)local_28);
  }
  if (local_60 != (void *)0x0) {
    operator_delete(local_60,local_50 - (long)local_60);
  }
  return;
}

Assistant:

TEST (SmallVector, ElementAccess) {
    pstore::small_vector<int, 4> buffer (std::size_t{4});
    int count = 42;
    for (std::size_t index = 0, end = buffer.size (); index != end; ++index) {
        buffer[index] = count++;
    }

    std::array<int, 4> const expected{{42, 43, 44, 45}};
    EXPECT_TRUE (std::equal (std::begin (buffer), std::end (buffer), std::begin (expected)));
}